

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O1

void __thiscall
lineage::heuristics::PartitionGraph::
PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (PartitionGraph *this,Data *data,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *edgeLabels)

{
  pointer *ppEVar1;
  uint uVar2;
  uint uVar3;
  Value VVar4;
  Value VVar5;
  long lVar6;
  pointer pAVar7;
  pointer pAVar8;
  pointer pVVar9;
  pointer pAVar10;
  iterator __position;
  ulong *puVar11;
  bool bVar12;
  ulong uVar13;
  size_t __new_size;
  pointer puVar14;
  ProblemGraph *pPVar15;
  pointer pEVar16;
  Value VVar17;
  pointer pAVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *__s;
  ComponentsBySearch<const_andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_&>
  components;
  SubgraphWithCut local_90;
  vector<bool,_std::allocator<bool>_> *local_80;
  value_type local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_38;
  
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
  super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
  super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).multipleEdgesEnabled_ =
       false;
  local_80 = &this->branchingLabels_;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->branchingEdgeCosts_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  this->data_ = data;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->partitions_).
  super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar15 = data->problemGraph;
  local_90.labels_ = edgeLabels;
  local_90.problemGraph_ = pPVar15;
  local_38 = &this->vertexLabels_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78,
             (long)(pPVar15->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pPVar15->graph_).vertices_.
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  __new_size = andres::graph::
               labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::heuristics::PartitionGraph::PartitionGraph<std::vector<unsigned_char,std::allocator<unsigned_char>>>(lineage::Data&,std::vector<unsigned_char,std::allocator<unsigned_char>>&)::SubgraphWithCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         (&pPVar15->graph_,&local_90,
                          (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           )local_78.from_.vector_.
                            super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->vertexLabels_,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78
            );
  if (local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  ::resize(&this->partitions_,__new_size);
  local_90.labels_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  puVar14 = (this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vertexLabels_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar14) {
    do {
      local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((this->partitions_).
                     super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + puVar14[(long)local_90.labels_]);
      std::
      _Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_long_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_long,false>>>>
                ((_Hashtable<unsigned_long,unsigned_long,std::allocator<unsigned_long>,std::__detail::_Identity,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,&local_90,&local_78);
      local_90.labels_ =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ((long)&((local_90.labels_)->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start + 1);
      puVar14 = (this->vertexLabels_).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (local_90.labels_ <
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)(this->vertexLabels_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar14 >> 3));
  }
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.from_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.to_.vector_.
  super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::_M_fill_insert((vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                    *)this,(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           vertices_.
                           super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                   ((long)(this->partitions_).
                          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->partitions_).
                          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
                   &local_78);
  if (local_78.to_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.to_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.to_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.to_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.from_.vector_.
      super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.from_.vector_.
                    super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.from_.vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pPVar15 = this->data_->problemGraph;
  pEVar16 = (pPVar15->graph_).edges_.
            super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((pPVar15->graph_).edges_.
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar16) {
    uVar20 = 0;
    do {
      VVar4 = pEVar16[uVar20].vertexIndices_[0];
      VVar5 = pEVar16[uVar20].vertexIndices_[1];
      lVar6 = (long)(pPVar15->problem_->nodes).
                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uVar2 = *(uint *)(lVar6 + VVar5 * 0x18);
      uVar3 = *(uint *)(lVar6 + VVar4 * 0x18);
      if (uVar3 != uVar2) {
        VVar17 = VVar4;
        if (uVar2 < uVar3) {
          VVar17 = VVar5;
          VVar5 = VVar4;
        }
        puVar14 = (this->vertexLabels_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pAVar7 = (pointer)puVar14[VVar17];
        pAVar8 = (pointer)puVar14[VVar5];
        if ((this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
            multipleEdgesEnabled_ == true) {
LAB_0013457e:
          __position._M_current =
               (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
               super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_78.from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pAVar7;
          local_78.from_.vector_.
          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pAVar8;
          if (__position._M_current ==
              (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_.
              super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
            ::_M_realloc_insert<andres::graph::detail::Edge<true,unsigned_long>>
                      ((vector<andres::graph::detail::Edge<true,unsigned_long>,std::allocator<andres::graph::detail::Edge<true,unsigned_long>>>
                        *)&(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                           edges_,__position,(Edge<true,_unsigned_long> *)&local_78);
          }
          else {
            (__position._M_current)->vertexIndices_[0] = (Value)pAVar7;
            (__position._M_current)->vertexIndices_[1] = (Value)pAVar8;
            ppEVar1 = &(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).edges_
                       .
                       super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppEVar1 = *ppEVar1 + 1;
          }
          uVar19 = ((long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                          edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
          andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
          insertAdjacenciesForEdge
                    (&this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,uVar19);
        }
        else {
          pVVar9 = (this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).vertices_.
                   super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar18 = *(pointer *)&((Adjacencies *)((long)(pVVar9 + (long)pAVar7) + 0x20))->vector_;
          pAVar10 = *(pointer *)((long)(pVVar9 + (long)pAVar7) + 0x28);
          uVar19 = (long)pAVar10 - (long)pAVar18 >> 4;
          while (uVar13 = uVar19, 0 < (long)uVar13) {
            uVar19 = uVar13 >> 1;
            if (*(pointer *)(pAVar18 + uVar19) < pAVar8) {
              pAVar18 = pAVar18 + uVar19 + 1;
              uVar19 = ~uVar19 + uVar13;
            }
          }
          if ((pAVar10 == pAVar18) || ((pointer)pAVar18->vertex_ != pAVar8)) {
            bVar12 = false;
            uVar19 = 0;
          }
          else {
            uVar19 = pAVar18->edge_;
            bVar12 = true;
          }
          if (!bVar12) goto LAB_0013457e;
        }
        updateEdgeCost(this,uVar19,
                       -(this->data_->costs).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar20]);
      }
      uVar20 = uVar20 + 1;
      pPVar15 = this->data_->problemGraph;
      pEVar16 = (pPVar15->graph_).edges_.
                super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar20 < (ulong)((long)(pPVar15->graph_).edges_.
                                    super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar16 >> 4)
            );
  }
  std::vector<bool,_std::allocator<bool>_>::resize
            (local_80,(long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                            edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->super_Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>).
                            edges_.
                            super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4,false);
  __s = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  puVar11 = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar2 = (this->branchingLabels_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (__s != puVar11) {
    memset(__s,0,(long)puVar11 - (long)__s);
    __s = puVar11;
  }
  if (uVar2 != 0) {
    *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar2 & 0x3fU));
  }
  return;
}

Assistant:

PartitionGraph(Data& data, ELABELS& edgeLabels)
      : data_(data)
    {
        size_t numberOfComponents{ 0 };

        { // construct vertex labels.

            struct SubgraphWithCut
            { // a subgraph with cut mask
                SubgraphWithCut(const ELABELS& labels,
                                const ProblemGraph& problemGraph)
                  : labels_(labels)
                  , problemGraph_(problemGraph)
                {
                }
                bool vertex(const std::size_t v) const { return true; }
                bool edge(const std::size_t e) const
                {
                    if (labels_[e] == 1)
                        return false;

                    const auto v0 = problemGraph_.graph().vertexOfEdge(e, 0);
                    const auto v1 = problemGraph_.graph().vertexOfEdge(e, 1);
                    if (problemGraph_.frameOfNode(v0) !=
                        problemGraph_.frameOfNode(v1))
                        return false;
                    return true;
                }

                const ELABELS& labels_;
                const ProblemGraph& problemGraph_;
            };

            // build decomposition based on the current multicut
            andres::graph::ComponentsBySearch<decltype(
                this->data_.problemGraph.graph())>
                components;
            numberOfComponents = components.build(
                this->data_.problemGraph.graph(),
                SubgraphWithCut(edgeLabels, this->data_.problemGraph));

            vertexLabels_ = components.labels_;
        }

        // construct partitions from initial labeling.
        partitions_.resize(numberOfComponents);
        for (size_t v = 0; v < vertexLabels_.size(); ++v) {
            partitions_[vertexLabels_[v]].insert(v);
        }

        // construct vertices and edges of branching graph.
        this->insertVertices(partitions_.size());

        for (size_t edge = 0; edge < data_.problemGraph.graph().numberOfEdges();
             ++edge) {
            auto v0 = data_.problemGraph.graph().vertexOfEdge(edge, 0);
            auto v1 = data_.problemGraph.graph().vertexOfEdge(edge, 1);

            const auto f0 = data_.problemGraph.frameOfNode(v0);
            const auto f1 = data_.problemGraph.frameOfNode(v1);

            // skip in-frame edges.
            if (f0 == f1) {
                continue;
            }

            if (f0 > f1) {
                std::swap(v0, v1);
            }

            const auto branchingEdgeId =
                this->insertEdge(vertexLabels_[v0], vertexLabels_[v1]);
            updateEdgeCost(branchingEdgeId,
                           -data_.costs[edge]); // negative costs because
                                                // BranchingOptimizer
                                                // *maximizes*
        }

        // initialize with empty branching.
        branchingLabels_.resize(this->numberOfEdges(), false);
        std::fill(branchingLabels_.begin(), branchingLabels_.end(), false);

#ifdef DEBUG
        std::cout << "Constructed partitionGraph:" << std::endl;
        std::cout << "  " << this->numberOfVertices() << " vertices"
                  << std::endl;
        std::cout << "  " << this->numberOfEdges() << " edges" << std::endl;
        std::cout << "  " << this->data_.problemGraph.graph().numberOfEdges()
                  << " original edges." << std::endl;
#endif
    }